

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O1

int linux_eventfd_init(eventfd *efd,filter *filt)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = eventfd(0,0x80800);
  if (iVar1 < 0) {
    iVar2 = -1;
  }
  else {
    efd->ef_id = iVar1;
    efd->ef_filt = filt;
  }
  return iVar2;
}

Assistant:

static int
linux_eventfd_init(struct eventfd *efd, struct filter *filt)
{
    int evfd;

    evfd = eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC);
    if (evfd < 0) {
        dbg_perror("eventfd");
        return (-1);
    }
    dbg_printf("eventfd=%i - created", evfd);
    efd->ef_id = evfd;
    efd->ef_filt = filt;

    return (0);
}